

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O3

void __thiscall
FIX50::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,Side *aSide,TransactTime *aTransactTime,
          OrdType *aOrdType)

{
  FieldBase FStack_88;
  
  MsgType();
  FIX50::Message::Message(&this->super_Message,(MsgType *)&FStack_88);
  FIX::FieldBase::~FieldBase(&FStack_88);
  *(undefined ***)&this->super_Message = &PTR__Message_0032aec0;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aClOrdID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSide,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aTransactTime,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrdType,true);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::Side& aSide,
      const FIX::TransactTime& aTransactTime,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aSide);
      set(aTransactTime);
      set(aOrdType);
    }